

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llil.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  llil_t<32UL> llil;
  llil_t<32UL> local_1930;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"usage: llil4map file1 file2 ... >out.txt\n",0x29);
    iVar1 = 1;
  }
  else {
    lVar4 = 0;
    do {
      *(undefined1 **)
       ((long)&local_1930.set.
               super_parallel_hash_set<5UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<string_cnt_t<12UL>_>,_phmap::Hash<string_cnt_t<12UL>_>,_phmap::EqualTo<string_cnt_t<12UL>_>,_std::allocator<string_cnt_t<12UL>_>_>
               .sets_._M_elems[0].set_.ctrl_ + lVar4) =
           phmap::priv::
           EmptyGroup<std::is_same<std::allocator<string_cnt_t<12ul>>,std::allocator<string_cnt_t<12ul>>>>()
           ::empty_group;
      *(undefined8 *)
       ((long)&local_1930.set.
               super_parallel_hash_set<5UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<string_cnt_t<12UL>_>,_phmap::Hash<string_cnt_t<12UL>_>,_phmap::EqualTo<string_cnt_t<12UL>_>,_std::allocator<string_cnt_t<12UL>_>_>
               .sets_._M_elems[0].set_ + lVar4 + 0x28) = 0;
      *(undefined8 *)
       ((long)&local_1930.set.
               super_parallel_hash_set<5UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<string_cnt_t<12UL>_>,_phmap::Hash<string_cnt_t<12UL>_>,_phmap::EqualTo<string_cnt_t<12UL>_>,_std::allocator<string_cnt_t<12UL>_>_>
               .sets_._M_elems[0].set_ + lVar4 + 8) = 0;
      *(undefined8 *)
       ((long)&local_1930.set.
               super_parallel_hash_set<5UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<string_cnt_t<12UL>_>,_phmap::Hash<string_cnt_t<12UL>_>,_phmap::EqualTo<string_cnt_t<12UL>_>,_std::allocator<string_cnt_t<12UL>_>_>
               .sets_._M_elems[0].set_ + lVar4 + 0x10) = 0;
      *(undefined8 *)
       ((long)&local_1930.set.
               super_parallel_hash_set<5UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<string_cnt_t<12UL>_>,_phmap::Hash<string_cnt_t<12UL>_>,_phmap::EqualTo<string_cnt_t<12UL>_>,_std::allocator<string_cnt_t<12UL>_>_>
               .sets_._M_elems[0].set_ + lVar4 + 0x18) = 0;
      lVar4 = lVar4 + 0x30;
    } while (lVar4 != 0x600);
    local_1930.num_lines.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    lVar4 = 0;
    do {
      boost::lockfree::
      queue<std::vector<string_cnt_t<12UL>,_std::allocator<string_cnt_t<12UL>_>_>_*>::queue
                ((queue<std::vector<string_cnt_t<12UL>,_std::allocator<string_cnt_t<12UL>_>_>_*> *)
                 (local_1930.consumers._M_elems[0].queue.padding1 + lVar4 + -8),10000);
      *(undefined8 *)((long)&local_1930.consumers._M_elems[0].thread._M_id._M_thread + lVar4) = 0;
      (&local_1930.consumers._M_elems[0].done)[lVar4]._M_base._M_i = false;
      lVar4 = lVar4 + 0x98;
    } while (lVar4 != 0x1300);
    lVar4 = std::chrono::_V2::system_clock::now();
    llil_t<32ul>::get_properties<6ul>((llil_t<32ul> *)&local_1930,argv + 1,argc + -1);
    lVar2 = std::chrono::_V2::system_clock::now();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,"get properties      ",0x14);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 8;
    poVar3 = std::ostream::_M_insert<double>((double)((lVar2 - lVar4) / 1000000) / 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," secs\n",6);
    llil_t<32UL>::~llil_t(&local_1930);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
   if (argc < 2) { std::cerr << "usage: llil4map file1 file2 ... >out.txt\n";  return 1; }

   llil_t<32> llil;

   show_time("get properties      ", [&]() { llil.get_properties<6>(&argv[1], argc - 1); });

   return 0;
}